

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenBinary(BinaryenModuleRef module,BinaryenOp op,BinaryenExpressionRef left,
              BinaryenExpressionRef right)

{
  Binary *pBVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pBVar1 = wasm::Builder::makeBinary(&local_10,op,left,right);
  return (BinaryenExpressionRef)pBVar1;
}

Assistant:

BinaryenExpressionRef BinaryenBinary(BinaryenModuleRef module,
                                     BinaryenOp op,
                                     BinaryenExpressionRef left,
                                     BinaryenExpressionRef right) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeBinary(BinaryOp(op), (Expression*)left, (Expression*)right));
}